

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O2

void __thiscall MissingDependencyScannerTest::CreateInitialState(MissingDependencyScannerTest *this)

{
  Edge *pEVar1;
  State *this_00;
  StringPiece text;
  StringPiece path;
  StringPiece path_00;
  allocator<char> local_59;
  string local_58;
  EvalString deps_type;
  
  deps_type.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps_type.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps_type.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text.len_ = 3;
  text.str_ = "gcc";
  EvalString::AddText(&deps_type,text);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"deps",&local_59);
  Rule::AddBinding(&this->compile_rule_,&local_58,&deps_type);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"deps",&local_59);
  Rule::AddBinding(&this->generator_rule_,&local_58,&deps_type);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = &this->state_;
  pEVar1 = State::AddEdge(this_00,&this->generator_rule_);
  path.len_ = 0x10;
  path.str_ = "generated_header";
  State::AddOut(this_00,pEVar1,path,0);
  pEVar1 = State::AddEdge(this_00,&this->compile_rule_);
  path_00.len_ = 0xf;
  path_00.str_ = "compiled_object";
  State::AddOut(this_00,pEVar1,path_00,0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&deps_type.parsed_);
  return;
}

Assistant:

void CreateInitialState() {
    EvalString deps_type;
    deps_type.AddText("gcc");
    compile_rule_.AddBinding("deps", deps_type);
    generator_rule_.AddBinding("deps", deps_type);
    Edge* header_edge = state_.AddEdge(&generator_rule_);
    state_.AddOut(header_edge, "generated_header", 0);
    Edge* compile_edge = state_.AddEdge(&compile_rule_);
    state_.AddOut(compile_edge, "compiled_object", 0);
  }